

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O1

void supfind1(errcxdef *ec,toktdef *tab,char *nam,objnum *objp,int required,int *errp,int warnlevel,
             int casefold)

{
  _func_int_toktdef_ptr_char_ptr_int_int_toksdef_ptr *p_Var1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char buf [40];
  toksdef local_86;
  char local_58 [40];
  
  sVar4 = strlen(nam);
  pcVar5 = nam;
  if (casefold != 0) {
    pcVar5 = local_58;
    strcpy(pcVar5,nam);
    os_strlwr(pcVar5);
  }
  p_Var1 = tab->toktfsea;
  uVar2 = tokhsh(pcVar5);
  iVar3 = (*p_Var1)(tab,pcVar5,(int)sVar4,uVar2,&local_86);
  if (iVar3 == 0) {
    if (required != 0 || 1 < warnlevel) {
      pcVar5 = errstr(ec,pcVar5,(int)sVar4);
      ec->errcxptr->erraav[0].errastr = pcVar5;
      ec->errcxptr->erraac = 1;
      errlogn(ec,(required == 0) + 0x1f7,"TADS");
    }
    *objp = 0xffff;
    if (required != 0) {
      *errp = 1;
    }
  }
  else {
    *objp = local_86.toksval;
  }
  return;
}

Assistant:

static void supfind1(errcxdef *ec, toktdef *tab, char *nam, objnum *objp,
                     int required, int *errp, int warnlevel, int casefold)
{
    toksdef sym;
    int     namel = strlen(nam);
    char    buf[40];

    if (casefold)
    {
        strcpy(buf, nam);
        os_strlwr(buf);
        nam = buf;
    }
    if ((*tab->toktfsea)(tab, nam, namel, tokhsh(nam), &sym))
    {
        *objp = (objnum)sym.toksval;
    }
    else
    {
        if (required || warnlevel > 1)
            errlog1(ec, (required ? ERR_RQOBJNF : ERR_WRNONF),
                    ERRTSTR, errstr(ec, nam, namel));
        *objp = MCMONINV;
        if (required) *errp = 1;
    }
}